

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O2

void __thiscall iqnet::ssl::LockContainer::LockContainer(LockContainer *this)

{
  undefined8 *puVar1;
  
  this->size = 1;
  puVar1 = (undefined8 *)operator_new__(0x30);
  *puVar1 = 1;
  boost::mutex::mutex((mutex *)(puVar1 + 1));
  this->locks = (mutex *)(puVar1 + 1);
  return;
}

Assistant:

LockContainer():
    size(CRYPTO_num_locks()),
    locks(new boost::mutex[size])
  {
  }